

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void terminate(void)

{
  _GLFWmonitor *monitor;
  long lVar1;
  
  _glfw.callbacks.monitor = (GLFWmonitorfun)0x0;
  _glfw.callbacks.joystick = (GLFWjoystickfun)0x0;
  while (_glfw.windowListHead != (_GLFWwindow *)0x0) {
    glfwDestroyWindow((GLFWwindow *)_glfw.windowListHead);
  }
  while (_glfw.cursorListHead != (_GLFWcursor *)0x0) {
    glfwDestroyCursor((GLFWcursor *)_glfw.cursorListHead);
  }
  if (0 < _glfw.monitorCount) {
    lVar1 = 0;
    do {
      monitor = _glfw.monitors[lVar1];
      if ((monitor->originalRamp).size != 0) {
        _glfwPlatformSetGammaRamp(monitor,&monitor->originalRamp);
      }
      _glfwFreeMonitor(monitor);
      lVar1 = lVar1 + 1;
    } while (lVar1 < _glfw.monitorCount);
  }
  free(_glfw.monitors);
  _glfw.monitors = (_GLFWmonitor **)0x0;
  _glfw.monitorCount = 0;
  _glfwTerminateVulkan();
  _glfwPlatformTerminate();
  memset(&_glfw,0,0xe88);
  return;
}

Assistant:

static void terminate(void)
{
    int i;

    memset(&_glfw.callbacks, 0, sizeof(_glfw.callbacks));

    while (_glfw.windowListHead)
        glfwDestroyWindow((GLFWwindow*) _glfw.windowListHead);

    while (_glfw.cursorListHead)
        glfwDestroyCursor((GLFWcursor*) _glfw.cursorListHead);

    for (i = 0;  i < _glfw.monitorCount;  i++)
    {
        _GLFWmonitor* monitor = _glfw.monitors[i];
        if (monitor->originalRamp.size)
            _glfwPlatformSetGammaRamp(monitor, &monitor->originalRamp);
        _glfwFreeMonitor(monitor);
    }

    free(_glfw.monitors);
    _glfw.monitors = NULL;
    _glfw.monitorCount = 0;

    _glfwTerminateVulkan();
    _glfwPlatformTerminate();

    memset(&_glfw, 0, sizeof(_glfw));
}